

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O3

void rtf_usleep(uint usec)

{
  return;
}

Assistant:

void rtf_usleep(unsigned int usec)
{
#ifdef IS_LINUX
    usleep(usec);
#endif
#ifdef IS_WINDOWS
    Sleep(usec / 1000);
#endif
}